

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef __thiscall llvm::sys::path::remove_leading_dotslash(path *this,StringRef Path,Style style)

{
  path *ppVar1;
  char *pcVar2;
  char *pcVar3;
  StringRef SVar4;
  
  pcVar3 = Path.Data;
  if ((char *)0x2 < pcVar3) {
    while (*this == (path)0x2e) {
      if ((this[1] != (path)0x2f) && ((int)Path.Length != 0 || this[1] != (path)0x5c)) break;
      ppVar1 = this + 2;
      pcVar2 = pcVar3 + -2;
      while( true ) {
        if ((*ppVar1 != (path)0x2f) && ((int)Path.Length != 0 || *ppVar1 != (path)0x5c)) break;
        ppVar1 = ppVar1 + 1;
        pcVar2 = pcVar2 + -1;
        if (pcVar2 == (char *)0x0) {
          this = this + (long)pcVar3;
          pcVar3 = (char *)0x0;
          goto LAB_00d9b3f7;
        }
      }
      this = ppVar1;
      pcVar3 = pcVar2;
      if (pcVar2 < (char *)0x3) break;
    }
  }
LAB_00d9b3f7:
  SVar4.Length = (size_t)pcVar3;
  SVar4.Data = (char *)this;
  return SVar4;
}

Assistant:

StringRef remove_leading_dotslash(StringRef Path, Style style) {
  // Remove leading "./" (or ".//" or "././" etc.)
  while (Path.size() > 2 && Path[0] == '.' && is_separator(Path[1], style)) {
    Path = Path.substr(2);
    while (Path.size() > 0 && is_separator(Path[0], style))
      Path = Path.substr(1);
  }
  return Path;
}